

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImU32 ImHash(void *data,int data_size,ImU32 seed)

{
  ImU32 i;
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  char *pcVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  
  if (ImHash::crc32_lut[1] == 0) {
    uVar2 = 0;
    do {
      iVar6 = 8;
      uVar8 = uVar2 & 0xffffffff;
      do {
        uVar7 = -((uint)uVar8 & 1) & 0xedb88320 ^ (uint)(uVar8 >> 1);
        uVar8 = (ulong)uVar7;
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
      ImHash::crc32_lut[uVar2] = uVar7;
      uVar2 = uVar2 + 1;
    } while (uVar2 != 0x100);
  }
  uVar7 = ~seed;
  if (data_size < 1) {
    pcVar5 = (char *)((long)data + 2);
    uVar1 = uVar7;
    do {
      uVar3 = (uint)(byte)pcVar5[-2];
      if (pcVar5[-2] != 0) {
        if (((uVar3 == 0x23) && (pcVar5[-1] == '#')) && (*pcVar5 == '#')) {
          uVar1 = uVar7;
        }
        uVar1 = uVar1 >> 8 ^ ImHash::crc32_lut[uVar1 & 0xff ^ uVar3];
      }
      pcVar5 = pcVar5 + 1;
    } while (uVar3 != 0);
  }
  else {
    lVar4 = 0;
    do {
      uVar7 = uVar7 >> 8 ^ ImHash::crc32_lut[(uint)*(byte *)((long)data + lVar4) ^ uVar7 & 0xff];
      lVar4 = lVar4 + 1;
      uVar1 = uVar7;
    } while (data_size != (int)lVar4);
  }
  return ~uVar1;
}

Assistant:

ImU32 ImHash(const void* data, int data_size, ImU32 seed)
{
    static ImU32 crc32_lut[256] = { 0 };
    if (!crc32_lut[1])
    {
        const ImU32 polynomial = 0xEDB88320;
        for (ImU32 i = 0; i < 256; i++)
        {
            ImU32 crc = i;
            for (ImU32 j = 0; j < 8; j++)
                crc = (crc >> 1) ^ (ImU32(-int(crc & 1)) & polynomial);
            crc32_lut[i] = crc;
        }
    }

    seed = ~seed;
    ImU32 crc = seed;
    const unsigned char* current = (const unsigned char*)data;

    if (data_size > 0)
    {
        // Known size
        while (data_size--)
            crc = (crc >> 8) ^ crc32_lut[(crc & 0xFF) ^ *current++];
    }
    else
    {
        // Zero-terminated string
        while (unsigned char c = *current++)
        {
            // We support a syntax of "label###id" where only "###id" is included in the hash, and only "label" gets displayed.
            // Because this syntax is rarely used we are optimizing for the common case.
            // - If we reach ### in the string we discard the hash so far and reset to the seed.
            // - We don't do 'current += 2; continue;' after handling ### to keep the code smaller.
            if (c == '#' && current[0] == '#' && current[1] == '#')
                crc = seed;
            crc = (crc >> 8) ^ crc32_lut[(crc & 0xFF) ^ c];
        }
    }
    return ~crc;
}